

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mocks.c
# Opt level: O1

_Bool have_always_expectation_for(char *function)

{
  int iVar1;
  int iVar2;
  undefined8 *puVar3;
  bool bVar4;
  
  iVar1 = cgreen_vector_size(global_expectation_queue);
  bVar4 = 0 < iVar1;
  if (0 < iVar1) {
    iVar1 = 0;
    do {
      puVar3 = (undefined8 *)cgreen_vector_get(global_expectation_queue,iVar1);
      iVar2 = strcmp((char *)*puVar3,function);
      if ((iVar2 == 0) && (*(int *)((long)puVar3 + 0x14) == 0xf314159)) {
        return bVar4;
      }
      iVar1 = iVar1 + 1;
      iVar2 = cgreen_vector_size(global_expectation_queue);
      bVar4 = iVar1 < iVar2;
    } while (iVar1 < iVar2);
  }
  return bVar4;
}

Assistant:

static bool have_always_expectation_for(const char* function) {
    for (int i = 0; i < cgreen_vector_size(global_expectation_queue); i++) {
        RecordedExpectation *expectation =
                (RecordedExpectation *)cgreen_vector_get(global_expectation_queue, i);
        if (strcmp(expectation->function, function) == 0) {
            if (is_always_call(expectation)) {
                return true;
            }
        }
    }

    return false;
}